

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  VCProject *project;
  QString *filtername;
  qsizetype qVar2;
  XmlOutput *pXVar3;
  undefined4 in_register_00000034;
  XmlOutput *this_00;
  long in_FS_OFFSET;
  int x;
  QString *compilerName;
  int i;
  QSet<QString> extraCompilersInProject;
  VCProject tempProj;
  parameter_type in_stack_fffffffffffff708;
  VCProject *in_stack_fffffffffffff710;
  VCProject *this_01;
  QString *in_stack_fffffffffffff718;
  QString *in_stack_fffffffffffff728;
  char *in_stack_fffffffffffff748;
  xml_output *in_stack_fffffffffffff758;
  xml_output *o;
  XmlOutput *in_stack_fffffffffffff760;
  XmlOutput *this_02;
  QString *in_stack_fffffffffffff778;
  int local_7ac;
  int local_79c;
  char local_730 [80];
  xml_output local_6e0;
  undefined1 local_690 [512];
  QList<QString> aQStack_490 [48];
  long local_8;
  
  this_00 = (XmlOutput *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pXVar3 = this_00;
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  decl(in_stack_fffffffffffff718,&in_stack_fffffffffffff710->Name);
  project = (VCProject *)XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  tag(in_stack_fffffffffffff728);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  attrS((char *)in_stack_fffffffffffff718,&in_stack_fffffffffffff710->Name);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  attrS((char *)in_stack_fffffffffffff718,&in_stack_fffffffffffff710->Name);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  attrS((char *)in_stack_fffffffffffff718,&in_stack_fffffffffffff710->Name);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  attrS((char *)in_stack_fffffffffffff718,&in_stack_fffffffffffff710->Name);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  attrS((char *)in_stack_fffffffffffff718,&in_stack_fffffffffffff710->Name);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  attrS((char *)in_stack_fffffffffffff718,&in_stack_fffffffffffff710->Name);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  attrS((char *)in_stack_fffffffffffff718,&in_stack_fffffffffffff710->Name);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  tag(in_stack_fffffffffffff728);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  tag(in_stack_fffffffffffff728);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  attrS((char *)in_stack_fffffffffffff718,&in_stack_fffffffffffff710->Name);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  closetag(in_stack_fffffffffffff728);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  tag(in_stack_fffffffffffff728);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  QString::~QString((QString *)0x276247);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  QString::~QString((QString *)0x276261);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  QString::~QString((QString *)0x276288);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  QString::~QString((QString *)0x2762a2);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  QString::~QString((QString *)0x27630a);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  QString::~QString((QString *)0x276324);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  QString::~QString((QString *)0x27633e);
  QString::~QString((QString *)0x27634b);
  (*this->_vptr_VCProjectWriter[0xe])(this,this_00,(long)__buf + 0xc0);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  closetag(in_stack_fffffffffffff728);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  tag(in_stack_fffffffffffff728);
  XmlOutput::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  QString::~QString((QString *)0x27641e);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff710);
  QString::~QString((QString *)0x276438);
  memset(local_690 + 0xf8,0xaa,0x120);
  VCProject::VCProject(in_stack_fffffffffffff710);
  QList<VCProjectSingleConfig>::operator+=
            ((QList<VCProjectSingleConfig> *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  outputFilter(project,pXVar3,in_stack_fffffffffffff778);
  QString::~QString((QString *)0x2764c6);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  outputFilter(project,pXVar3,in_stack_fffffffffffff778);
  QString::~QString((QString *)0x276514);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  outputFilter(project,pXVar3,in_stack_fffffffffffff778);
  QString::~QString((QString *)0x276562);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  outputFilter(project,pXVar3,in_stack_fffffffffffff778);
  QString::~QString((QString *)0x2765b0);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  outputFilter(project,pXVar3,in_stack_fffffffffffff778);
  QString::~QString((QString *)0x2765fe);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  outputFilter(project,pXVar3,in_stack_fffffffffffff778);
  QString::~QString((QString *)0x27664c);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  outputFilter(project,pXVar3,in_stack_fffffffffffff778);
  QString::~QString((QString *)0x27669a);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  outputFilter(project,pXVar3,in_stack_fffffffffffff778);
  QString::~QString((QString *)0x2766e8);
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  outputFilter(project,pXVar3,in_stack_fffffffffffff778);
  QString::~QString((QString *)0x276736);
  local_690._24_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
  QSet<QString>::QSet((QSet<QString> *)0x276752);
  local_79c = 0;
  while( true ) {
    filtername = (QString *)(long)local_79c;
    qVar2 = QList<VCFilter>::size((QList<VCFilter> *)((long)__buf + 0x39f0));
    if (qVar2 <= (long)filtername) break;
    QList<VCFilter>::at((QList<VCFilter> *)in_stack_fffffffffffff710,
                        (qsizetype)in_stack_fffffffffffff708);
    bVar1 = QSet<QString>::contains
                      ((QSet<QString> *)in_stack_fffffffffffff710,&in_stack_fffffffffffff708->Name);
    if (!bVar1) {
      QSet<QString>::operator+=
                ((QSet<QString> *)in_stack_fffffffffffff718,&in_stack_fffffffffffff710->Name);
      QList<QString>::operator+=
                ((QList<QString> *)in_stack_fffffffffffff710,&in_stack_fffffffffffff708->Name);
    }
    local_79c = local_79c + 1;
  }
  local_7ac = 0;
  while( true ) {
    qVar2 = QList<QString>::size(aQStack_490);
    if (qVar2 <= local_7ac) break;
    QList<QString>::at((QList<QString> *)in_stack_fffffffffffff710,
                       (qsizetype)in_stack_fffffffffffff708);
    outputFilter(project,pXVar3,filtername);
    local_7ac = local_7ac + 1;
  }
  this_01 = (VCProject *)local_690;
  QString::QString(in_stack_fffffffffffff718,in_stack_fffffffffffff748);
  this_02 = (XmlOutput *)(local_690 + 0xf8);
  outputFilter(project,pXVar3,filtername);
  QString::~QString((QString *)0x2768fb);
  o = &local_6e0;
  QString::QString((QString *)this_00,in_stack_fffffffffffff748);
  closetag(in_stack_fffffffffffff728);
  XmlOutput::operator<<(this_02,o);
  QString::QString((QString *)this_00,local_730);
  tag(in_stack_fffffffffffff728);
  pXVar3 = XmlOutput::operator<<(this_02,o);
  QString::QString((QString *)0x2769a2);
  ::data((QString *)pXVar3);
  XmlOutput::operator<<(this_02,o);
  XmlOutput::xml_output::~xml_output((xml_output *)this_01);
  QString::~QString((QString *)0x2769dc);
  XmlOutput::xml_output::~xml_output((xml_output *)this_01);
  QString::~QString((QString *)0x2769f0);
  XmlOutput::xml_output::~xml_output((xml_output *)this_01);
  QString::~QString((QString *)0x276a04);
  QSet<QString>::~QSet((QSet<QString> *)0x276a11);
  VCProject::~VCProject(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, VCProjectSingleConfig &tool)
{
    xml << decl("1.0", "Windows-1252")
        << tag(_VisualStudioProject)
        << attrS(_ProjectType, "Visual C++")
        << attrS(_Version, tool.Version)
        << attrS(_Name, tool.Name)
        << attrS(_ProjectGUID, tool.ProjectGUID)
        << attrS(_Keyword, tool.Keyword)
        << attrS(_SccProjectName, tool.SccProjectName)
        << attrS(_SccLocalPath, tool.SccLocalPath)
        << tag(_Platforms)
        << tag(_Platform)
        << attrS(_Name, tool.PlatformName)
        << closetag(_Platforms)
        << tag(_Configurations);
    write(xml, tool.Configuration);
    xml << closetag(_Configurations)
        << tag(q_Files);
    // Add this configuration into a multi-config project, since that's where we have the flat/tree
    // XML output functionality
    VCProject tempProj;
    tempProj.SingleProjects += tool;
    outputFilter(tempProj, xml, "Source Files");
    outputFilter(tempProj, xml, "Header Files");
    outputFilter(tempProj, xml, "Generated Files");
    outputFilter(tempProj, xml, "LexYacc Files");
    outputFilter(tempProj, xml, "Translation Files");
    outputFilter(tempProj, xml, "Form Files");
    outputFilter(tempProj, xml, "Resource Files");
    outputFilter(tempProj, xml, "Deployment Files");
    outputFilter(tempProj, xml, "Distribution Files");

    QSet<QString> extraCompilersInProject;
    for (int i = 0; i < tool.ExtraCompilersFiles.size(); ++i) {
        const QString &compilerName = tool.ExtraCompilersFiles.at(i).Name;
        if (!extraCompilersInProject.contains(compilerName)) {
            extraCompilersInProject += compilerName;
            tempProj.ExtraCompilers += compilerName;
        }
    }

    for (int x = 0; x < tempProj.ExtraCompilers.size(); ++x) {
        outputFilter(tempProj, xml, tempProj.ExtraCompilers.at(x));
    }
    outputFilter(tempProj, xml, "Root Files");
    xml     << closetag(q_Files)
            << tag(_Globals)
                << data(); // No "/>" end tag
}